

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QSharedPointer<QRelation>_>::end(QList<QSharedPointer<QRelation>_> *this)

{
  QSharedPointer<QRelation> *n;
  QArrayDataPointer<QSharedPointer<QRelation>_> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QSharedPointer<QRelation>_> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QSharedPointer<QRelation>_> *)0x15cbc9);
  QArrayDataPointer<QSharedPointer<QRelation>_>::operator->(in_RDI);
  n = QArrayDataPointer<QSharedPointer<QRelation>_>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }